

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

int __thiscall
QFusionStyle::styleHint
          (QFusionStyle *this,StyleHint hint,QStyleOption *option,QWidget *widget,
          QStyleHintReturn *returnData)

{
  undefined1 auVar1 [16];
  int aleft;
  int iVar2;
  int iVar3;
  Int IVar4;
  QStyleOptionComboBox *pQVar5;
  QColor *pQVar6;
  QStyleHintReturnMask *pQVar7;
  QStyleOptionGroupBox *pQVar8;
  QStyleOption *in_RDX;
  undefined4 in_ESI;
  QStyleHintReturn *in_R8;
  long in_FS_OFFSET;
  QStyleOptionGroupBox *groupBox;
  QStyleHintReturnMask *mask;
  QStyleOptionComboBox *cmb;
  QFlags<Qt::AlignmentFlag> vAlign;
  int in_stack_fffffffffffffe78;
  AlignmentFlag in_stack_fffffffffffffe7c;
  enum_type in_stack_fffffffffffffe80;
  enum_type in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  uint local_15c;
  uint local_104;
  QFlagsStorage<Qt::AlignmentFlag> local_100;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_fc;
  undefined1 local_f8 [16];
  QRegion local_e8;
  undefined1 local_e0 [8];
  QStyleHintReturn *in_stack_ffffffffffffff28;
  QRegion in_stack_ffffffffffffff30;
  QStyleOption *in_stack_ffffffffffffff38;
  StyleHint in_stack_ffffffffffffff44;
  QRegion in_stack_ffffffffffffff48;
  undefined1 local_b0 [16];
  QRegion local_a0;
  undefined1 local_98 [16];
  QRegion local_88;
  undefined1 local_80 [16];
  QRegion local_70;
  undefined1 local_68 [16];
  QRegion local_58;
  undefined1 local_50 [16];
  QRegion local_40;
  QRegion local_38;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_2c;
  undefined1 local_28 [16];
  undefined8 local_18;
  undefined4 local_10;
  undefined2 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_ESI) {
  case 0:
  case 0xc:
  case 0xe:
  case 0x11:
  case 0x25:
  case 0x36:
  case 0x48:
    local_104 = 0;
    break;
  default:
    goto LAB_004f7328;
  case 2:
  case 7:
  case 0xb:
  case 0xd:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x1a:
  case 0x1b:
  case 0x33:
  case 0x3c:
  case 0x4f:
  case 0x61:
    local_104 = 1;
    break;
  case 0x10:
    local_104 = 0xe1;
    break;
  case 0x19:
    pQVar5 = qstyleoption_cast<QStyleOptionComboBox_const*>(in_RDX);
    auVar1._8_8_ = local_28._8_8_;
    auVar1._0_8_ = local_28._0_8_;
    if (pQVar5 == (QStyleOptionComboBox *)0x0) {
      local_104 = 0;
    }
    else {
      local_104 = (uint)((pQVar5->editable ^ 0xffU) & 1);
      local_28 = auVar1;
    }
    break;
  case 0x1f:
    pQVar8 = qstyleoption_cast<QStyleOptionGroupBox_const*>(in_RDX);
    if ((pQVar8 != (QStyleOptionGroupBox *)0x0) && (pQVar8 != (QStyleOptionGroupBox *)0x0)) {
      local_fc.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)0xaaaaaaaa;
      local_fc.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QFlags<Qt::AlignmentFlag>::operator&
                     ((QFlags<Qt::AlignmentFlag> *)
                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      in_stack_fffffffffffffe7c);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_fc);
      if (IVar4 == 0) {
        QFlags<Qt::AlignmentFlag>::QFlags
                  ((QFlags<Qt::AlignmentFlag> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe7c);
      }
      else {
        local_100 = local_fc.super_QFlagsStorage<Qt::AlignmentFlag>.i;
      }
      local_104 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_100);
      break;
    }
    goto LAB_004f7328;
  case 0x22:
    if (in_RDX == (QStyleOption *)0x0) {
      local_15c = 0;
    }
    else {
      QPalette::window((QPalette *)0x4f6d7f);
      pQVar6 = QBrush::color((QBrush *)0x4f6d87);
      local_28 = QColor::darker((int)pQVar6);
      local_18 = local_28._0_8_;
      local_10 = local_28._8_4_;
      local_c = local_28._12_2_;
      local_15c = QColor::rgba();
    }
    local_104 = local_15c;
    break;
  case 0x37:
    pQVar7 = qstyleoption_cast<QStyleHintReturnMask*>(in_R8);
    if (pQVar7 != (QStyleHintReturnMask *)0x0) {
      QRegion::QRegion(&local_38,(QRect *)&in_RDX->rect,Rectangle);
      QRegion::operator=((QRegion *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (QRegion *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      QRegion::~QRegion(&local_38);
      aleft = QRect::left((QRect *)0x4f6eb0);
      QRect::top((QRect *)0x4f6ec2);
      QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),aleft,
                   in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      QRegion::QRegion(&local_40,(QRect *)local_50,Rectangle);
      QRegion::operator-=(&pQVar7->region,(QRegion *)&local_40);
      QRegion::~QRegion(&local_40);
      iVar2 = QRect::left((QRect *)0x4f6f28);
      QRect::top((QRect *)0x4f6f3a);
      QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffe8c,iVar2),aleft,
                   in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      QRegion::QRegion(&local_58,(QRect *)local_68,Rectangle);
      QRegion::operator-=(&pQVar7->region,(QRegion *)&local_58);
      QRegion::~QRegion(&local_58);
      iVar3 = QRect::left((QRect *)0x4f6fa3);
      QRect::top((QRect *)0x4f6fb5);
      QRect::QRect((QRect *)CONCAT44(iVar3,iVar2),aleft,in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      QRegion::QRegion(&local_70,(QRect *)local_80,Rectangle);
      QRegion::operator-=(&pQVar7->region,(QRegion *)&local_70);
      QRegion::~QRegion(&local_70);
      QRect::left((QRect *)0x4f701e);
      QRect::top((QRect *)0x4f7030);
      QRect::QRect((QRect *)CONCAT44(iVar3,iVar2),aleft,in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      QRegion::QRegion(&local_88,(QRect *)local_98,Rectangle);
      QRegion::operator-=(&pQVar7->region,(QRegion *)&local_88);
      QRegion::~QRegion(&local_88);
      QRect::right((QRect *)0x4f7099);
      QRect::top((QRect *)0x4f70ae);
      QRect::QRect((QRect *)CONCAT44(iVar3,iVar2),aleft,in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      QRegion::QRegion(&local_a0,(QRect *)local_b0,Rectangle);
      QRegion::operator-=(&pQVar7->region,(QRegion *)&local_a0);
      QRegion::~QRegion(&local_a0);
      QRect::right((QRect *)0x4f7114);
      QRect::top((QRect *)0x4f7129);
      QRect::QRect((QRect *)CONCAT44(iVar3,iVar2),aleft,in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      QRegion::QRegion((QRegion *)&stack0xffffffffffffff48,(QRect *)&stack0xffffffffffffff38,
                       Rectangle);
      QRegion::operator-=(&pQVar7->region,(QRegion *)&stack0xffffffffffffff48);
      QRegion::~QRegion((QRegion *)&stack0xffffffffffffff48);
      QRect::right((QRect *)0x4f7192);
      QRect::top((QRect *)0x4f71a7);
      QRect::QRect((QRect *)CONCAT44(iVar3,iVar2),aleft,in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      QRegion::QRegion((QRegion *)&stack0xffffffffffffff30,(QRect *)local_e0,Rectangle);
      QRegion::operator-=(&pQVar7->region,(QRegion *)&stack0xffffffffffffff30);
      QRegion::~QRegion((QRegion *)&stack0xffffffffffffff30);
      QRect::right((QRect *)0x4f7210);
      QRect::top((QRect *)0x4f7222);
      QRect::QRect((QRect *)CONCAT44(iVar3,iVar2),aleft,in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      QRegion::QRegion(&local_e8,(QRect *)local_f8,Rectangle);
      QRegion::operator-=(&pQVar7->region,(QRegion *)&local_e8);
      QRegion::~QRegion(&local_e8);
      local_104 = 1;
      break;
    }
LAB_004f7328:
    local_104 = QCommonStyle::styleHint
                          ((QCommonStyle *)in_stack_ffffffffffffff48.d,in_stack_ffffffffffffff44,
                           in_stack_ffffffffffffff38,(QWidget *)in_stack_ffffffffffffff30.d,
                           in_stack_ffffffffffffff28);
    break;
  case 0x46:
    local_2c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
         (QFlagsStorage<Qt::TextInteractionFlag>)
         Qt::operator|(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
    local_104 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
    break;
  case 0x4e:
    local_104 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_104;
  }
  __stack_chk_fail();
}

Assistant:

int QFusionStyle::styleHint(StyleHint hint, const QStyleOption *option, const QWidget *widget,
                            QStyleHintReturn *returnData) const
{
    switch (hint) {
    case SH_Slider_SnapToValue:
    case SH_PrintDialog_RightAlignButtons:
    case SH_FontDialog_SelectAssociatedText:
    case SH_MenuBar_AltKeyNavigation:
    case SH_ComboBox_ListMouseTracking:
    case SH_Slider_StopMouseOverSlider:
    case SH_ScrollBar_MiddleClickAbsolutePosition:
    case SH_TitleBar_AutoRaise:
    case SH_TitleBar_NoBorder:
    case SH_ItemView_ShowDecorationSelected:
    case SH_ItemView_ArrowKeysNavigateIntoChildren:
    case SH_ItemView_ChangeHighlightOnFocus:
    case SH_MenuBar_MouseTracking:
    case SH_Menu_MouseTracking:
    case SH_Menu_SupportsSections:
        return 1;

#if defined(QT_PLATFORM_UIKIT)
    case SH_ComboBox_UseNativePopup:
        return 1;
#endif

    case SH_EtchDisabledText:
    case SH_ToolBox_SelectedPageTitleBold:
    case SH_ScrollView_FrameOnlyAroundContents:
    case SH_Menu_AllowActiveAndDisabled:
    case SH_MainWindow_SpaceBelowMenuBar:
    case SH_MessageBox_CenterButtons:
    case SH_RubberBand_Mask:
        return 0;

    case SH_ComboBox_Popup:
        if (const QStyleOptionComboBox *cmb = qstyleoption_cast<const QStyleOptionComboBox *>(option))
            return !cmb->editable;
        return 0;

    case SH_Table_GridLineColor:
        return option ? option->palette.window().color().darker(120).rgba() : 0;

    case SH_MessageBox_TextInteractionFlags:
        return Qt::TextSelectableByMouse | Qt::LinksAccessibleByMouse;
#if QT_CONFIG(wizard)
    case SH_WizardStyle:
        return QWizard::ClassicStyle;
#endif
    case SH_Menu_SubMenuPopupDelay:
        return 225; // default from GtkMenu

    case SH_WindowFrame_Mask:
        if (QStyleHintReturnMask *mask = qstyleoption_cast<QStyleHintReturnMask *>(returnData)) {
            //left rounded corner
            mask->region = option->rect;
            mask->region -= QRect(option->rect.left(), option->rect.top(), 5, 1);
            mask->region -= QRect(option->rect.left(), option->rect.top() + 1, 3, 1);
            mask->region -= QRect(option->rect.left(), option->rect.top() + 2, 2, 1);
            mask->region -= QRect(option->rect.left(), option->rect.top() + 3, 1, 2);

            //right rounded corner
            mask->region -= QRect(option->rect.right() - 4, option->rect.top(), 5, 1);
            mask->region -= QRect(option->rect.right() - 2, option->rect.top() + 1, 3, 1);
            mask->region -= QRect(option->rect.right() - 1, option->rect.top() + 2, 2, 1);
            mask->region -= QRect(option->rect.right() , option->rect.top() + 3, 1, 2);
            return 1;
        }
        break;
    case SH_GroupBox_TextLabelVerticalAlignment: {
        if (const auto *groupBox = qstyleoption_cast<const QStyleOptionGroupBox *>(option)) {
            if (groupBox) {
                const auto vAlign = groupBox->textAlignment & Qt::AlignVertical_Mask;
                // default fusion style is AlignTop
                return vAlign == 0 ? Qt::AlignTop : vAlign;
            }
        }
        break;
    }
    default:
        break;
    }
    return QCommonStyle::styleHint(hint, option, widget, returnData);
}